

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void req0_recv_cb(void *arg)

{
  long lVar1;
  nni_aio *aio_00;
  nng_err nVar2;
  uint32_t uVar3;
  nni_msg *m;
  size_t sVar4;
  void *pvVar5;
  uint32_t id;
  nni_aio *aio;
  nni_msg *msg;
  req0_ctx *ctx;
  req0_sock *s;
  req0_pipe *p;
  void *arg_local;
  
  lVar1 = *(long *)((long)arg + 8);
  nVar2 = nni_aio_result((nni_aio *)((long)arg + 0x208));
  if (nVar2 == NNG_OK) {
    m = nni_aio_get_msg((nni_aio *)((long)arg + 0x208));
    nni_aio_set_msg((nni_aio *)((long)arg + 0x208),(nni_msg *)0x0);
    uVar3 = nni_pipe_id(*arg);
    nni_msg_set_pipe(m,uVar3);
    sVar4 = nni_msg_len(m);
    if (sVar4 < 4) {
      nni_msg_free(m);
      nni_pipe_close(*arg);
    }
    else {
      uVar3 = nni_msg_trim_u32(m);
      nni_mtx_lock((nni_mtx *)(lVar1 + 0x358));
      nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x208));
      pvVar5 = nni_id_get((nni_id_map *)(lVar1 + 0x2f8),(ulong)uVar3);
      if (((pvVar5 == (void *)0x0) || (*(long *)((long)pvVar5 + 0x58) != 0)) ||
         (*(long *)((long)pvVar5 + 0x70) != 0)) {
        nni_mtx_unlock((nni_mtx *)(lVar1 + 0x358));
        nni_msg_free(m);
      }
      else {
        nni_list_node_remove((nni_list_node *)((long)pvVar5 + 0x18));
        nni_id_remove((nni_id_map *)(lVar1 + 0x2f8),(ulong)uVar3);
        *(undefined4 *)((long)pvVar5 + 0x48) = 0;
        if (*(long *)((long)pvVar5 + 0x60) != 0) {
          if (0 < *(int *)((long)pvVar5 + 0x78)) {
            nni_msg_free(*(nni_msg **)((long)pvVar5 + 0x60));
          }
          *(undefined8 *)((long)pvVar5 + 0x60) = 0;
        }
        aio_00 = *(nni_aio **)((long)pvVar5 + 0x50);
        if (aio_00 == (nni_aio *)0x0) {
          *(nni_msg **)((long)pvVar5 + 0x70) = m;
          if (pvVar5 == (void *)(lVar1 + 0x10)) {
            nni_pollable_raise((nni_pollable *)(lVar1 + 0x330));
          }
          nni_mtx_unlock((nni_mtx *)(lVar1 + 0x358));
        }
        else {
          *(undefined8 *)((long)pvVar5 + 0x50) = 0;
          nni_mtx_unlock((nni_mtx *)(lVar1 + 0x358));
          nni_aio_set_msg(aio_00,m);
          sVar4 = nni_msg_len(m);
          nni_aio_finish_sync(aio_00,NNG_OK,sVar4);
        }
      }
    }
  }
  else {
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
req0_recv_cb(void *arg)
{
	req0_pipe *p = arg;
	req0_sock *s = p->req;
	req0_ctx  *ctx;
	nni_msg   *msg;
	nni_aio   *aio;
	uint32_t   id;

	if (nni_aio_result(&p->aio_recv) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	msg = nni_aio_get_msg(&p->aio_recv);
	nni_aio_set_msg(&p->aio_recv, NULL);
	nni_msg_set_pipe(msg, nni_pipe_id(p->pipe));

	// We yank 4 bytes from front of body, and move them to the header.
	if (nni_msg_len(msg) < 4) {
		// Malformed message.
		goto malformed;
	}
	id = nni_msg_trim_u32(msg);

	// Schedule another receive while we are processing this.
	nni_mtx_lock(&s->mtx);

	// NB: If close was called, then this will just abort.
	nni_pipe_recv(p->pipe, &p->aio_recv);

	// Look for a context to receive it.
	if (((ctx = nni_id_get(&s->requests, id)) == NULL) ||
	    (ctx->send_aio != NULL) || (ctx->rep_msg != NULL)) {
		nni_mtx_unlock(&s->mtx);
		// No waiting context, we have not sent the request out to
		// the wire yet, or context already has a reply ready.
		// Discard the message.
		nni_msg_free(msg);
		return;
	}

	// We have our match, so we can remove this.
	nni_list_node_remove(&ctx->send_node);
	nni_id_remove(&s->requests, id);
	ctx->request_id = 0;
	if (ctx->req_msg != NULL) {
		// Only free msg if we originally cloned it (for retries)
		if (ctx->retry > 0) {
			nni_msg_free(ctx->req_msg);
		}
		ctx->req_msg = NULL;
	}

	// Is there an aio waiting for us?
	if ((aio = ctx->recv_aio) != NULL) {
		ctx->recv_aio = NULL;
		nni_mtx_unlock(&s->mtx);
		nni_aio_set_msg(aio, msg);
		nni_aio_finish_sync(aio, 0, nni_msg_len(msg));
	} else {
		// No AIO, so stash msg.  Receive will pick it up later.
		ctx->rep_msg = msg;
		if (ctx == &s->master) {
			nni_pollable_raise(&s->readable);
		}
		nni_mtx_unlock(&s->mtx);
	}
	return;

malformed:
	nni_msg_free(msg);
	nni_pipe_close(p->pipe);
}